

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.c
# Opt level: O3

void local_proxy_opener_free(DeferredSocketOpener *opener)

{
  burnstr((char *)opener[-0xd].vt);
  if ((prompts_t *)opener[-5].vt != (prompts_t *)0x0) {
    free_prompts((prompts_t *)opener[-5].vt);
  }
  sk_addr_free((SockAddr *)opener[-0xb].vt);
  conf_free((Conf *)opener[-9].vt);
  safefree(opener + -0xf);
  return;
}

Assistant:

static void local_proxy_opener_free(DeferredSocketOpener *opener)
{
    LocalProxyOpener *lp = container_of(opener, LocalProxyOpener, opener);
    burnstr(lp->formatted_cmd);
    if (lp->prompts)
        free_prompts(lp->prompts);
    sk_addr_free(lp->addr);
    conf_free(lp->conf);
    sfree(lp);
}